

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmBitFieldDn<(moira::Instr)139,(moira::Mode)6,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char cVar9;
  byte bVar10;
  Dn dn;
  uint uVar11;
  undefined1 local_44 [20];
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  if (((short)uVar4 < 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)139,(moira::Mode)6,4>(this,str,addr,op);
    return;
  }
  uVar11 = uVar4 & 0xffff;
  uVar5 = uVar11 >> 6;
  uVar6 = uVar5 & 0x1f;
  s = &str->ptr;
  cVar9 = 'b';
  lVar7 = 1;
  do {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = cVar9;
    cVar9 = "bfins"[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar8 = str->ptr;
    do {
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
    } while (pcVar8 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(uVar11 >> 0xc & 7));
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  Op<(moira::Mode)6,4>((Ea<(moira::Mode)6,_4> *)local_44,this,op & 7,addr);
  StrWriter::operator<<(str,(Ea<(moira::Mode)6,_4> *)local_44);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    uVar11 = uVar4 & 0x820;
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ',';
    if (uVar11 < 0x800) {
      if (uVar11 != 0) {
        sprintd_signed(s,(ulong)uVar6);
LAB_003c4713:
        pcVar8 = str->ptr;
        str->ptr = pcVar8 + 1;
        *pcVar8 = ',';
        StrWriter::operator<<(str,(Dn)(uVar4 & 7));
        goto LAB_003c478e;
      }
      sprintd_signed(s,(ulong)uVar6);
      pcVar8 = *s;
      *s = pcVar8 + 1;
    }
    else {
      if (uVar11 != 0x800) {
        StrWriter::operator<<(str,(Dn)(uVar5 & 7));
        goto LAB_003c4713;
      }
      StrWriter::operator<<(str,(Dn)(uVar5 & 7));
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
    }
    *pcVar8 = ',';
    sprintd_signed(s,(ulong)(uVar4 & 0x1f));
    goto LAB_003c478e;
  }
  bVar10 = 0x20;
  if ((uVar4 & 0x1f) != 0) {
    bVar10 = (byte)uVar11 & 0x1f;
  }
  uVar4 = uVar4 & 0x820;
  if (uVar4 < 0x800) {
    if (uVar4 != 0) {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '{';
      sprintd_signed(s,(ulong)uVar6);
LAB_003c4760:
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ':';
      dn.raw._1_3_ = 0;
      dn.raw._0_1_ = bVar10 & 7;
      StrWriter::operator<<(str,dn);
      goto LAB_003c477f;
    }
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ' ';
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = '{';
    sprintd_signed(s,(ulong)uVar6);
    pcVar8 = *s;
    *s = pcVar8 + 1;
    *pcVar8 = ':';
    sprintd_signed(s,(ulong)bVar10);
    pcVar8 = *s;
    *s = pcVar8 + 1;
  }
  else {
    if (uVar4 != 0x800) {
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
      str->ptr = pcVar8 + 1;
      *pcVar8 = '{';
      StrWriter::operator<<(str,(Dn)(uVar5 & 7));
      goto LAB_003c4760;
    }
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = '{';
    StrWriter::operator<<(str,(Dn)(uVar5 & 7));
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ':';
    sprintd_signed(s,(ulong)bVar10);
LAB_003c477f:
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
  }
  *pcVar8 = '}';
LAB_003c478e:
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar9 = ';';
    lVar7 = 1;
    do {
      pcVar8 = *s;
      *s = pcVar8 + 1;
      *pcVar8 = cVar9;
      cVar9 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmBitFieldDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word>(addr);
    auto dst = _____________xxx(op);
    auto o   = _____xxxxx______(ext);
    auto w   = ___________xxxxx(ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << str.tab;

    if constexpr (I == Instr::BFINS) {
        str << Dn ( _xxx____________(ext) ) << Sep{};
    }

    str << Op<M, S>(dst, addr);

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (ext & 0x0820) {

                case 0x0000: str << "," << o << "," << w; break;
                case 0x0020: str << "," << o << "," << Dn{w&7}; break;
                case 0x0800: str << "," << Dn{o&7} << "," << w; break;
                case 0x0820: str << "," << Dn{o&7} << "," << Dn{w&7}; break;
            }
            break;

        default:

            if (w == 0) w = 32;

            switch (ext & 0x0820) {

                case 0x0000: str << " {" << o << ":" << w << "}"; break;
                case 0x0020: str << " {" << o << ":" << Dn{w&7} << "}"; break;
                case 0x0800: str << " {" << Dn{o&7} << ":" << w << "}"; break;
                case 0x0820: str << " {" << Dn{o&7} << ":" << Dn{w&7} << "}"; break;
            }
    }

    if constexpr (I == Instr::BFEXTU || I == Instr::BFEXTS || I == Instr::BFFFO) {
        str << Sep{} << Dn ( _xxx____________(ext) );
    }
    str << Av<I, M, S>{};
}